

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O0

double AccumulateLSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  double dVar1;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  double sse;
  double diff;
  uint8_t *s;
  int j;
  int i;
  double value;
  double best_sse;
  int x_1;
  int x_0;
  int y_1;
  int y_0;
  double total_sse;
  int local_28;
  int y;
  int x;
  int h_local;
  int w_local;
  int ref_stride_local;
  uint8_t *ref_local;
  int src_stride_local;
  
  _y_1 = 0.0;
  for (total_sse._4_4_ = 0; total_sse._4_4_ < h; total_sse._4_4_ = total_sse._4_4_ + 1) {
    if (total_sse._4_4_ + -2 < 0) {
      local_7c = 0;
    }
    else {
      local_7c = total_sse._4_4_ + -2;
    }
    local_80 = h;
    if (total_sse._4_4_ + 3 < h) {
      local_80 = total_sse._4_4_ + 3;
    }
    for (local_28 = 0; local_28 < w; local_28 = local_28 + 1) {
      if (local_28 + -2 < 0) {
        local_84 = 0;
      }
      else {
        local_84 = local_28 + -2;
      }
      local_88 = w;
      if (local_28 + 3 < w) {
        local_88 = local_28 + 3;
      }
      value = 65025.0;
      for (s._0_4_ = local_7c; (int)s < local_80; s._0_4_ = (int)s + 1) {
        for (s._4_4_ = local_84; s._4_4_ < local_88; s._4_4_ = s._4_4_ + 1) {
          dVar1 = ((double)src[(long)s._4_4_ + (long)((int)s * src_stride)] -
                  (double)ref[total_sse._4_4_ * ref_stride + local_28]) *
                  ((double)src[(long)s._4_4_ + (long)((int)s * src_stride)] -
                  (double)ref[total_sse._4_4_ * ref_stride + local_28]);
          if (dVar1 < value) {
            value = dVar1;
          }
        }
      }
      _y_1 = value + _y_1;
    }
  }
  return _y_1;
}

Assistant:

static double AccumulateLSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  int x, y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    const int y_0 = (y - RADIUS < 0) ? 0 : y - RADIUS;
    const int y_1 = (y + RADIUS + 1 >= h) ? h : y + RADIUS + 1;
    for (x = 0; x < w; ++x) {
      const int x_0 = (x - RADIUS < 0) ? 0 : x - RADIUS;
      const int x_1 = (x + RADIUS + 1 >= w) ? w : x + RADIUS + 1;
      double best_sse = 255. * 255.;
      const double value = (double)ref[y * ref_stride + x];
      int i, j;
      for (j = y_0; j < y_1; ++j) {
        const uint8_t* const s = src + j * src_stride;
        for (i = x_0; i < x_1; ++i) {
          const double diff = s[i] - value;
          const double sse = diff * diff;
          if (sse < best_sse) best_sse = sse;
        }
      }
      total_sse += best_sse;
    }
  }
  return total_sse;
}